

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O1

int mg_send_http_error(mg_connection *conn,int status,char *fmt,...)

{
  char cVar1;
  _func_int_mg_connection_ptr_int_char_ptr *p_Var2;
  undefined8 conn_00;
  char in_AL;
  char *pcVar3;
  size_t sVar4;
  long lVar5;
  ptrdiff_t pVar6;
  int *piVar7;
  undefined8 in_RCX;
  mg_file *filep;
  mg_file_stat *extraout_RDX;
  mg_file_stat *filep_00;
  mg_file_stat *extraout_RDX_00;
  time_t *t;
  int iVar8;
  undefined8 in_R8;
  undefined8 in_R9;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  int truncated;
  va_list ap;
  va_list ap_1;
  char date [64];
  char path_buf [4096];
  char errmsg_buf [8192];
  int local_31cc;
  char *local_31c8;
  int local_31bc;
  mg_connection *local_31b8;
  ulong local_31b0;
  char *local_31a8;
  time_t local_31a0;
  mg_file local_3198;
  undefined8 local_3168;
  undefined1 *puStack_3160;
  undefined1 *local_3158;
  __va_list_tag local_3148;
  char local_3128 [64];
  undefined1 local_30e8 [24];
  undefined8 local_30d0;
  undefined8 local_30c8;
  undefined8 local_30c0;
  undefined4 local_30b8;
  undefined8 local_30a8;
  undefined8 local_3098;
  undefined8 local_3088;
  undefined8 local_3078;
  undefined8 local_3068;
  undefined8 local_3058;
  undefined8 local_3048;
  char acStack_3039 [4065];
  undefined1 local_2058;
  char local_2038 [8200];
  
  local_3158 = local_30e8;
  if (in_AL != '\0') {
    local_30b8 = in_XMM0_Da;
    local_30a8 = in_XMM1_Qa;
    local_3098 = in_XMM2_Qa;
    local_3088 = in_XMM3_Qa;
    local_3078 = in_XMM4_Qa;
    local_3068 = in_XMM5_Qa;
    local_3058 = in_XMM6_Qa;
    local_3048 = in_XMM7_Qa;
  }
  puStack_3160 = &stack0x00000008;
  local_3168 = 0x3000000018;
  local_3198.stat.is_directory = 0;
  local_3198.stat.is_gzipped = 0;
  local_3198.stat.location = 0;
  local_3198.stat._28_4_ = 0;
  local_3198.stat.size = 0;
  local_3198.stat.last_modified = 0;
  local_3198.access.fp = (FILE *)0x0;
  if (fmt == (char *)0x0 || conn == (mg_connection *)0x0) {
    return -2;
  }
  conn->status_code = status;
  local_30d0 = in_RCX;
  local_30c8 = in_R8;
  local_30c0 = in_R9;
  if ((((199 < status) && (status != 0x130)) && (status != 0xcc)) ||
     ((conn->in_error_handler == 0 &&
      ((conn->phys_ctx->callbacks).http_error != (_func_int_mg_connection_ptr_int_char_ptr *)0x0))))
  {
    local_3148.gp_offset = 0x18;
    local_3148.fp_offset = 0x30;
    local_3148.overflow_arg_area = puStack_3160;
    local_3148.reg_save_area = local_3158;
    mg_vsnprintf(conn,(int *)0x0,local_2038,0x2000,fmt,&local_3148);
  }
  if ((conn->in_error_handler == 0) &&
     (p_Var2 = (conn->phys_ctx->callbacks).http_error,
     p_Var2 != (_func_int_mg_connection_ptr_int_char_ptr *)0x0)) {
    conn->in_error_handler = 1;
    iVar10 = (*p_Var2)(conn,status,local_2038);
    conn->in_error_handler = 0;
    if (iVar10 == 0) {
      return 0;
    }
  }
  if (conn->in_error_handler == 0) {
    local_31c8 = conn->dom_ctx->config[0x37];
    if (local_31c8 != (char *)0x0) {
      local_31a8 = conn->dom_ctx->config[0x24];
      local_31b0 = (ulong)(uint)(status / 100);
      uVar11 = 1;
      conn_00 = (long)acStack_3039 + 1;
      iVar10 = 0;
      local_31b8 = conn;
      do {
        if (uVar11 == 2) {
          pcVar3 = "%serror%01uxx.";
        }
        else if (uVar11 == 1) {
          pcVar3 = "%serror%03u.";
        }
        else {
          pcVar3 = "%serror.";
        }
        filep = (mg_file *)0xfe0;
        mg_snprintf(conn,&local_31cc,(char *)conn_00,0xfe0,pcVar3,local_31c8);
        local_2058 = 0;
        pcVar3 = strchr(local_31a8,0x2e);
        if (pcVar3 != (char *)0x0) {
          local_31bc = iVar10;
          sVar4 = strlen((char *)conn_00);
          iVar10 = (int)sVar4;
          iVar8 = 0xfe0;
          if (iVar10 < 0xfe0) {
            iVar8 = iVar10;
          }
          lVar5 = (long)iVar10;
          filep = (mg_file *)0xfe0;
          filep_00 = extraout_RDX;
          if (0xfdf < lVar5) {
            lVar5 = 0xfe0;
          }
          do {
            uVar9 = 1;
            do {
              cVar1 = pcVar3[uVar9];
              if ((cVar1 == '\0') || (cVar1 == ',')) goto LAB_0010d464;
              acStack_3039[uVar9 + lVar5] = cVar1;
              uVar9 = uVar9 + 1;
            } while (uVar9 != 0x20);
            uVar9 = 0x20;
LAB_0010d464:
            acStack_3039[(long)(iVar8 + -1 + (int)uVar9) + 1] = 0;
            iVar10 = mg_stat((mg_connection *)conn_00,(char *)&local_3198,filep_00);
            if (iVar10 != 0) {
              conn = local_31b8;
              iVar10 = 1;
              break;
            }
            pcVar3 = strchr(pcVar3 + (uVar9 & 0xffffffff),0x2e);
            filep_00 = extraout_RDX_00;
            conn = local_31b8;
            iVar10 = local_31bc;
          } while (pcVar3 != (char *)0x0);
        }
      } while ((uVar11 < 3) && (uVar11 = uVar11 + 1, iVar10 == 0));
      if (iVar10 != 0) {
        conn->in_error_handler = 1;
        if (conn->dom_ctx != (mg_domain_context *)0x0) {
          pVar6 = match_prefix_strlen(conn->dom_ctx->config[0x20],(char *)((long)acStack_3039 + 1));
          if (pVar6 < 1) {
            handle_static_file_request
                      (conn,(char *)((long)acStack_3039 + 1),&local_3198,(char *)0x0,(char *)0x0);
          }
          else {
            local_31a0 = time((time_t *)0x0);
            iVar10 = mg_fopen((mg_connection *)((long)acStack_3039 + 1),(char *)0x1,(int)&local_3198
                              ,filep);
            if (iVar10 == 0) {
              piVar7 = __errno_location();
              pcVar3 = strerror(*piVar7);
              mg_send_http_error(conn,500,"Error: Cannot read file\nfopen(%s): %s",
                                 (long)acStack_3039 + 1,pcVar3);
            }
            else {
              conn->must_close = 1;
              gmt_time_string(local_3128,(size_t)&local_31a0,t);
              fclose_on_exec(&local_3198.access,conn);
              mg_response_header_start(conn,200);
              send_no_cache_header(conn);
              pcVar3 = conn->dom_ctx->config[0x38];
              if ((pcVar3 != (char *)0x0) && (*pcVar3 != '\0')) {
                mg_response_header_add_lines(conn,pcVar3);
              }
              send_cors_header(conn);
              mg_response_header_add(conn,"Content-Type","text/html",-1);
              mg_response_header_send(conn);
              send_ssi_file(conn,(char *)((long)acStack_3039 + 1),&local_3198,0);
              if ((FILE *)local_3198.access.fp != (FILE *)0x0) {
                fclose((FILE *)local_3198.access.fp);
              }
            }
          }
        }
        conn->in_error_handler = 0;
        return 0;
      }
    }
  }
  conn->must_close = 1;
  mg_response_header_start(conn,status);
  send_no_cache_header(conn);
  pcVar3 = conn->dom_ctx->config[0x38];
  if ((pcVar3 != (char *)0x0) && (*pcVar3 != '\0')) {
    mg_response_header_add_lines(conn,pcVar3);
  }
  send_cors_header(conn);
  if (status < 200) {
    mg_response_header_send(conn);
    return 0;
  }
  if ((status != 0xcc) && (status != 0x130)) {
    mg_response_header_add(conn,"Content-Type","text/plain; charset=utf-8",-1);
  }
  mg_response_header_send(conn);
  if (status != 0xcc) {
    if (status != 0x130) {
      pcVar3 = mg_get_response_code_text(conn,status);
      mg_printf(conn,"Error %d: %s\n",(ulong)(uint)status,pcVar3);
      sVar4 = strlen(local_2038);
      mg_write(conn,local_2038,sVar4);
      return 0;
    }
    return 0;
  }
  return 0;
}

Assistant:

CIVETWEB_API int
mg_send_http_error(struct mg_connection *conn, int status, const char *fmt, ...)
{
	va_list ap;
	int ret;

	va_start(ap, fmt);
	ret = mg_send_http_error_impl(conn, status, fmt, ap);
	va_end(ap);

	return ret;
}